

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<QString,_QVariant>::emplace_helper<QVariant>
          (QHash<QString,_QVariant> *this,QString *key,QVariant *args)

{
  uchar *puVar1;
  byte bVar2;
  Entry *pEVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  PrivateShared *pPVar7;
  undefined8 uVar8;
  piter pVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  long in_FS_OFFSET;
  undefined1 local_68 [32];
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined8 uStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<QString,_QVariant>_>::findOrInsert<QString>
            ((InsertionResult *)local_68,this->d,key);
  pEVar3 = (*(Span **)(local_68._0_8_ + 0x20))[(ulong)local_68._8_8_ >> 7].entries;
  bVar2 = (*(Span **)(local_68._0_8_ + 0x20))[(ulong)local_68._8_8_ >> 7].offsets
          [(uint)local_68._8_8_ & 0x7f];
  if (local_68[0x10] == false) {
    pDVar4 = (key->d).d;
    (key->d).d = (Data *)0x0;
    *(Data **)pEVar3[bVar2].storage.data = pDVar4;
    pcVar5 = (key->d).ptr;
    (key->d).ptr = (char16_t *)0x0;
    *(char16_t **)(pEVar3[bVar2].storage.data + 8) = pcVar5;
    qVar6 = (key->d).size;
    (key->d).size = 0;
    *(qsizetype *)(pEVar3[bVar2].storage.data + 0x10) = qVar6;
    pPVar7 = (args->d).data.shared;
    uVar8 = *(undefined8 *)((long)&(args->d).data + 8);
    uVar10 = (args->d).field_0x18;
    uVar11 = (args->d).field_0x19;
    uVar12 = (args->d).field_0x1a;
    uVar13 = (args->d).field_0x1b;
    uVar14 = (args->d).field_0x1c;
    uVar15 = (args->d).field_0x1d;
    uVar16 = (args->d).field_0x1e;
    uVar17 = (args->d).field_0x1f;
    puVar1 = pEVar3[bVar2].storage.data + 0x28;
    *(undefined8 *)puVar1 = *(undefined8 *)((long)&(args->d).data + 0x10);
    puVar1[8] = uVar10;
    puVar1[9] = uVar11;
    puVar1[10] = uVar12;
    puVar1[0xb] = uVar13;
    puVar1[0xc] = uVar14;
    puVar1[0xd] = uVar15;
    puVar1[0xe] = uVar16;
    puVar1[0xf] = uVar17;
    puVar1 = pEVar3[bVar2].storage.data + 0x18;
    *(PrivateShared **)puVar1 = pPVar7;
    *(undefined8 *)(puVar1 + 8) = uVar8;
    (args->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(args->d).data + 8) = 0;
    *(undefined8 *)((long)&(args->d).data + 0x10) = 0;
    *(undefined8 *)&(args->d).field_0x18 = 2;
  }
  else {
    local_48.shared = (args->d).data.shared;
    local_48._8_8_ = *(undefined8 *)((long)&(args->d).data + 8);
    local_48._16_8_ = *(undefined8 *)((long)&(args->d).data + 0x10);
    uStack_30 = *(undefined8 *)&(args->d).field_0x18;
    (args->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(args->d).data + 8) = 0;
    *(undefined8 *)((long)&(args->d).data + 0x10) = 0;
    *(undefined8 *)&(args->d).field_0x18 = 2;
    ::QVariant::operator=((QVariant *)(pEVar3[bVar2].storage.data + 0x18),(QVariant *)&local_48);
    ::QVariant::~QVariant((QVariant *)&local_48);
  }
  pVar9.bucket = local_68._8_8_;
  pVar9.d = (Data<QHashPrivate::Node<QString,_QVariant>_> *)local_68._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar9;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }